

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

UChar32 __thiscall
icu_63::number::impl::NumberStringBuilder::getLastCodePoint(NumberStringBuilder *this)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ValueOrHeapArray<char16_t> *pVVar7;
  long lVar8;
  uint uVar9;
  
  iVar3 = this->fLength;
  lVar8 = (long)iVar3;
  if (lVar8 == 0) {
    uVar5 = 0xffffffff;
  }
  else {
    if (this->fUsingHeap == false) {
      pVVar7 = &this->fChars;
    }
    else {
      pVVar7 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
    }
    iVar4 = this->fZero;
    uVar9 = iVar3 - 1;
    if (((1 < iVar3) &&
        ((*(ushort *)((long)pVVar7 + lVar8 * 2 + (long)iVar4 * 2 + -2) & 0xfc00) == 0xdc00)) &&
       ((*(ushort *)((long)pVVar7 + lVar8 * 2 + (long)iVar4 * 2 + -4) & 0xfc00) == 0xd800)) {
      uVar9 = iVar3 - 2;
    }
    uVar1 = *(ushort *)((long)pVVar7 + (long)(int)uVar9 * 2 + (long)iVar4 * 2);
    uVar6 = (uint)uVar1;
    uVar5 = (uint)uVar1;
    if ((uVar5 & 0xf800) == 0xd800) {
      if ((uVar1 >> 10 & 1) == 0) {
        if (uVar9 + 1 == iVar3) {
          return uVar5;
        }
        uVar2 = *(ushort *)((long)pVVar7 + (long)(int)(uVar9 + 1) * 2 + (long)iVar4 * 2);
        uVar9 = (uint)uVar2;
        if ((uVar2 & 0xfc00) != 0xdc00) {
          return uVar5;
        }
        uVar6 = (uint)uVar1 << 10;
      }
      else {
        if ((int)uVar9 < 1) {
          return uVar5;
        }
        uVar1 = *(ushort *)((long)pVVar7 + (ulong)uVar9 * 2 + (long)iVar4 * 2 + -2);
        if ((uVar1 & 0xfc00) != 0xd800) {
          return uVar5;
        }
        uVar9 = (uint)uVar1 << 10;
      }
      return uVar6 + uVar9 + -0x35fdc00;
    }
  }
  return uVar5;
}

Assistant:

UChar32 NumberStringBuilder::getLastCodePoint() const {
    if (fLength == 0) {
        return -1;
    }
    int32_t offset = fLength;
    U16_BACK_1(getCharPtr() + fZero, 0, offset);
    UChar32 cp;
    U16_GET(getCharPtr() + fZero, 0, offset, fLength, cp);
    return cp;
}